

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treelstm.cc
# Opt level: O2

Expression __thiscall
dynet::UnidirectionalTreeLSTMBuilder::add_input
          (UnidirectionalTreeLSTMBuilder *this,int id,vector<int,_std::allocator<int>_> *children,
          Expression *x)

{
  uint *puVar1;
  uint *puVar2;
  RNNPointer prev;
  RNNPointer local_44;
  Expression local_40;
  
  local_44 = -1;
  local_40 = RNNBuilder::add_input(&(this->node_builder).super_RNNBuilder,&local_44,x);
  local_44 = (this->node_builder).super_RNNBuilder.cur;
  puVar1 = (uint *)(children->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
  for (puVar2 = (uint *)(children->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    local_40 = RNNBuilder::add_input
                         (&(this->node_builder).super_RNNBuilder,&local_44,
                          (this->h).
                          super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                          _M_impl.super__Vector_impl_data._M_start + *puVar2);
    local_44 = (this->node_builder).super_RNNBuilder.cur;
  }
  std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::push_back(&this->h,&local_40);
  return local_40;
}

Assistant:

Expression UnidirectionalTreeLSTMBuilder::add_input(int id, vector<int> children, const Expression& x) {
  DYNET_ASSERT(id >= 0 && h.size() == (unsigned)id, "Failed dimension check in TreeLSTMBuilder");

  RNNPointer prev = (RNNPointer)(-1);
  Expression embedding = node_builder.add_input(prev, x);
  prev = node_builder.state();

  for (unsigned child : children) {
    embedding = node_builder.add_input(prev, h[child]);
    prev = node_builder.state();
  }
  h.push_back(embedding);
  return embedding;
}